

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError FillInDevInfo(PaAlsaHostApiRepresentation *alsaApi,HwDevInfo *deviceHwInfo,int blocking,
                     PaAlsaDeviceInfo *devInfo,int *devIdx)

{
  int iVar1;
  PaError PVar2;
  int iVar3;
  PaAlsaDeviceInfo *in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  int *in_R8;
  PaUtilHostApiRepresentation *baseApi;
  snd_pcm_t *pcm;
  PaDeviceInfo *baseDeviceInfo;
  PaError result;
  int in_stack_ffffffffffffffd0;
  snd_pcm_stream_t stream;
  PaAlsaDeviceInfo *devInfo_00;
  
  stream = SND_PCM_STREAM_PLAYBACK;
  devInfo_00 = in_RCX;
  InitializeDeviceInfo(&in_RCX->baseDeviceInfo);
  iVar3 = (int)((ulong)in_RCX >> 0x20);
  if ((((*(int *)(in_RSI + 3) == 0) ||
       (iVar1 = OpenPcm((snd_pcm_t **)devInfo_00,(char *)in_R8,stream,in_stack_ffffffffffffffd0,
                        iVar3), iVar1 < 0)) ||
      (PVar2 = GropeDevice((snd_pcm_t *)0x0,*(int *)(in_RSI + 2),StreamDirection_In,in_EDX,
                           devInfo_00), PVar2 == 0)) &&
     (((*(int *)((long)in_RSI + 0x14) == 0 ||
       (iVar3 = OpenPcm((snd_pcm_t **)devInfo_00,(char *)in_R8,stream,in_stack_ffffffffffffffd0,
                        iVar3), iVar3 < 0)) ||
      (PVar2 = GropeDevice((snd_pcm_t *)0x0,*(int *)(in_RSI + 2),StreamDirection_Out,in_EDX,
                           devInfo_00), PVar2 == 0)))) {
    (in_RCX->baseDeviceInfo).structVersion = 2;
    (in_RCX->baseDeviceInfo).hostApi = *(PaHostApiIndex *)(in_RDI + 0x110);
    (in_RCX->baseDeviceInfo).name = (char *)in_RSI[1];
    devInfo_00->alsaName = (char *)*in_RSI;
    devInfo_00->isPlug = *(int *)(in_RSI + 2);
    if ((0 < (in_RCX->baseDeviceInfo).maxInputChannels) ||
       (0 < (in_RCX->baseDeviceInfo).maxOutputChannels)) {
      if (((*(int *)(in_RDI + 0x1c) == -1) ||
          (iVar3 = strcmp((char *)*in_RSI,"default"), iVar3 == 0)) &&
         (0 < (in_RCX->baseDeviceInfo).maxInputChannels)) {
        *(int *)(in_RDI + 0x1c) = *in_R8;
      }
      if (((*(int *)(in_RDI + 0x20) == -1) ||
          (iVar3 = strcmp((char *)*in_RSI,"default"), iVar3 == 0)) &&
         (0 < (in_RCX->baseDeviceInfo).maxOutputChannels)) {
        *(int *)(in_RDI + 0x20) = *in_R8;
      }
      *(PaAlsaDeviceInfo **)(*(long *)(in_RDI + 0x28) + (long)*in_R8 * 8) = devInfo_00;
      *in_R8 = *in_R8 + 1;
    }
  }
  return stream;
}

Assistant:

static PaError FillInDevInfo( PaAlsaHostApiRepresentation *alsaApi, HwDevInfo* deviceHwInfo, int blocking,
        PaAlsaDeviceInfo* devInfo, int* devIdx )
{
    PaError result = 0;
    PaDeviceInfo *baseDeviceInfo = &devInfo->baseDeviceInfo;
    snd_pcm_t *pcm = NULL;
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;

    PA_DEBUG(( "%s: Filling device info for: %s\n", __FUNCTION__, deviceHwInfo->name ));

    /* Zero fields */
    InitializeDeviceInfo( baseDeviceInfo );

    /* To determine device capabilities, we must open the device and query the
     * hardware parameter configuration space */

    /* Query capture */
    if( deviceHwInfo->hasCapture &&
        OpenPcm( &pcm, deviceHwInfo->alsaName, SND_PCM_STREAM_CAPTURE, blocking, 0 ) >= 0 )
    {
        if( GropeDevice( pcm, deviceHwInfo->isPlug, StreamDirection_In, blocking, devInfo ) != paNoError )
        {
            /* Error */
            PA_DEBUG(( "%s: Failed groping %s for capture\n", __FUNCTION__, deviceHwInfo->alsaName ));
            goto end;
        }
    }

    /* Query playback */
    if( deviceHwInfo->hasPlayback &&
        OpenPcm( &pcm, deviceHwInfo->alsaName, SND_PCM_STREAM_PLAYBACK, blocking, 0 ) >= 0 )
    {
        if( GropeDevice( pcm, deviceHwInfo->isPlug, StreamDirection_Out, blocking, devInfo ) != paNoError )
        {
            /* Error */
            PA_DEBUG(( "%s: Failed groping %s for playback\n", __FUNCTION__, deviceHwInfo->alsaName ));
            goto end;
        }
    }

    baseDeviceInfo->structVersion = 2;
    baseDeviceInfo->hostApi = alsaApi->hostApiIndex;
    baseDeviceInfo->name = deviceHwInfo->name;
    devInfo->alsaName = deviceHwInfo->alsaName;
    devInfo->isPlug = deviceHwInfo->isPlug;

    /* A: Storing pointer to PaAlsaDeviceInfo object as pointer to PaDeviceInfo object.
     * Should now be safe to add device info, unless the device supports neither capture nor playback
     */
    if( baseDeviceInfo->maxInputChannels > 0 || baseDeviceInfo->maxOutputChannels > 0 )
    {
        /* Make device default if there isn't already one or it is the ALSA "default" device */
        if( ( baseApi->info.defaultInputDevice == paNoDevice ||
            !strcmp( deviceHwInfo->alsaName, "default" ) ) && baseDeviceInfo->maxInputChannels > 0 )
        {
            baseApi->info.defaultInputDevice = *devIdx;
            PA_DEBUG(( "Default input device: %s\n", deviceHwInfo->name ));
        }
        if( ( baseApi->info.defaultOutputDevice == paNoDevice ||
            !strcmp( deviceHwInfo->alsaName, "default" ) ) && baseDeviceInfo->maxOutputChannels > 0 )
        {
            baseApi->info.defaultOutputDevice = *devIdx;
            PA_DEBUG(( "Default output device: %s\n", deviceHwInfo->name ));
        }
        PA_DEBUG(( "%s: Adding device %s: %d\n", __FUNCTION__, deviceHwInfo->name, *devIdx ));
        baseApi->deviceInfos[*devIdx] = (PaDeviceInfo *) devInfo;
        (*devIdx) += 1;
    }
    else
    {
        PA_DEBUG(( "%s: Skipped device: %s, all channels == 0\n", __FUNCTION__, deviceHwInfo->name ));
    }

end:
    return result;
}